

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Cord::RemovePrefix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  char *pcVar2;
  uint uVar3;
  byte bVar4;
  CordRep *pCVar5;
  long lVar6;
  ulong extraout_RAX;
  ulong uVar7;
  CordRep *pCVar8;
  size_t sVar9;
  CordRep *old;
  CordRep *pCVar10;
  string death_message;
  CordzUpdateScope scope;
  undefined1 local_130 [32];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  long local_60;
  char *local_58;
  char local_50 [32];
  
  bVar4 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)(char)bVar4 & 1U) == 0) {
    uVar7 = (ulong)(long)(char)bVar4 >> 1;
  }
  else {
    uVar7 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar7 < n) {
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Check n <= size() failed: ","");
    local_c0.piece_._M_len = 0x16;
    local_c0.piece_._M_str = "Requested prefix size ";
    pcVar2 = local_f0.digits_;
    lVar6 = absl::lts_20240722::numbers_internal::FastIntToBuffer(n,pcVar2);
    local_f0.piece_._M_len = lVar6 - (long)pcVar2;
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    uVar7 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar7 & 1) == 0) {
      sVar9 = uVar7 >> 1;
    }
    else {
      sVar9 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    local_f0.piece_._M_str = pcVar2;
    local_60 = absl::lts_20240722::numbers_internal::FastIntToBuffer(sVar9,local_50);
    local_60 = local_60 - (long)local_50;
    local_58 = local_50;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_130,&local_c0,&local_f0,&local_90);
    std::__cxx11::string::_M_append((char *)local_110,local_130._0_8_);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x2a6,local_110);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2a6,"void absl::Cord::RemovePrefix(size_t)");
  }
  pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar5 != (CordRep *)0x0 && (bVar4 & 1) != 0) && (pCVar5->length == 0)) {
    RemovePrefix();
  }
  pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if (pCVar5 == (CordRep *)0x0 || ((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    InlineRep::remove_prefix(&this->contents_,n);
    return;
  }
  local_f0.piece_._M_len = (size_t)cord_internal::InlineData::cordz_info((InlineData *)this);
  if ((CordzInfo *)local_f0.piece_._M_len != (CordzInfo *)0x0) {
    absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_f0.piece_._M_len);
  }
  pCVar10 = pCVar5;
  if ((pCVar5->tag == '\x02') &&
     (RemovePrefix(), pCVar10 = (CordRep *)local_c0.piece_._M_len, (extraout_RAX & 1) == 0)) {
    LOCK();
    (((RefcountAndFlags *)(local_c0.piece_._M_len + 8))->count_).super___atomic_base<int>._M_i =
         (((RefcountAndFlags *)(local_c0.piece_._M_len + 8))->count_).super___atomic_base<int>._M_i
         + 2;
    UNLOCK();
    cord_internal::CordRep::Unref(pCVar5);
  }
  if (n < pCVar10->length) {
    pCVar5 = pCVar10;
    if (pCVar10->tag == '\x01') {
      if ((pCVar10->refcount).count_.super___atomic_base<int>._M_i == 2) {
        if (pCVar10->tag != '\x01') {
          __assert_fail("IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x35a,"CordRepSubstring *absl::cord_internal::CordRep::substring()");
        }
        pCVar10[1].length = pCVar10[1].length + n;
        pCVar10->length = pCVar10->length - n;
        goto LAB_0010d431;
      }
    }
    else if (pCVar10->tag == '\x03') {
      pCVar5 = (CordRep *)absl::lts_20240722::cord_internal::CordRepBtree::SubTree((ulong)pCVar10,n)
      ;
      LOCK();
      pRVar1 = &pCVar10->refcount;
      uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar3 & 1) == 0 && (int)uVar3 < 1) goto LAB_0010d64a;
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar10);
      }
      goto LAB_0010d431;
    }
    sVar9 = pCVar10->length - n;
    if (sVar9 == 0) {
      __assert_fail("n != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a2,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (pCVar10->length < n || sVar9 == 0) {
      __assert_fail("pos < rep->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a3,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (n == 0) {
      LOCK();
      (pCVar10->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar10->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    else {
      pCVar8 = pCVar10;
      if (pCVar10->tag == '\x01') {
        n = n + pCVar10[1].length;
        pCVar8 = *(CordRep **)&pCVar10[1].refcount;
      }
      pCVar5 = (CordRep *)operator_new(0x20);
      pCVar5->length = 0;
      pCVar5->refcount = (atomic<int>)0x0;
      pCVar5->tag = '\0';
      pCVar5->storage[0] = '\0';
      pCVar5->storage[1] = '\0';
      pCVar5->storage[2] = '\0';
      pCVar5[1].length = 0;
      pCVar5[1].refcount = (atomic<int>)0x0;
      pCVar5[1].tag = '\0';
      pCVar5[1].storage[0] = '\0';
      pCVar5[1].storage[1] = '\0';
      pCVar5[1].storage[2] = '\0';
      (pCVar5->refcount).count_.super___atomic_base<int>._M_i = 2;
      pCVar5->length = sVar9;
      pCVar5->tag = '\x01';
      pCVar5[1].length = n;
      if (pCVar8 == (CordRep *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      (pCVar8->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar8->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      *(CordRep **)&pCVar5[1].refcount = pCVar8;
    }
    LOCK();
    pRVar1 = &pCVar10->refcount;
    uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) != 0 || 0 < (int)uVar3) {
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar10);
      }
LAB_0010d431:
      sVar9 = local_f0.piece_._M_len;
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("data_.is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x508,
                      "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (pCVar5 == (CordRep *)0x0) {
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      }
      else {
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar5;
      }
      if ((CordzInfo *)local_f0.piece_._M_len != (CordzInfo *)0x0) {
        absl::lts_20240722::Mutex::AssertHeld();
        *(CordRep **)(sVar9 + 0x40) = pCVar5;
      }
      cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&local_f0);
      return;
    }
  }
  else {
    LOCK();
    pRVar1 = &pCVar10->refcount;
    uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) != 0 || 0 < (int)uVar3) {
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar10);
      }
      pCVar5 = (CordRep *)0x0;
      goto LAB_0010d431;
    }
  }
LAB_0010d64a:
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

void Cord::RemovePrefix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested prefix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.remove_prefix(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemovePrefix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      CordRep* old = tree;
      tree = tree->btree()->SubTree(n, tree->length - n);
      CordRep::Unref(old);
    } else if (tree->IsSubstring() && tree->refcount.IsOne()) {
      tree->substring()->start += n;
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, n, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}